

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O3

Error asmjit::v1_14::x86::FuncInternal::initFuncDetail
                (FuncDetail *func,FuncSignature *signature,uint32_t registerSize)

{
  byte *pbVar1;
  FuncDetail FVar2;
  byte bVar3;
  RegType RVar4;
  FuncValue *pFVar5;
  RegOrder *pRVar6;
  uint uVar7;
  uint32_t uVar8;
  FuncDetail *pFVar9;
  byte bVar10;
  uint uVar11;
  uint32_t valueIndex;
  int iVar12;
  size_t sVar13;
  uint32_t valueIndex_1;
  ulong uVar14;
  FuncDetail *pFVar15;
  uint uVar16;
  bool bVar17;
  uint local_84;
  RegGroup local_7d [5];
  FuncDetail *local_78;
  FuncDetail *local_70;
  FuncDetail *local_68;
  uint32_t local_5c;
  FuncDetail *local_58;
  FuncSignature *local_50;
  FuncValue *local_48;
  FuncValue *local_40;
  FuncDetail *local_38;
  
  local_84 = (uint)(byte)func[4];
  pFVar5 = (FuncValue *)(ulong)(byte)func[0x74];
  local_70 = func;
  local_5c = registerSize;
  local_50 = signature;
  local_40 = pFVar5;
  if (*(int *)(func + 0x8c) != 0) {
    pFVar15 = func + 0x8c;
    FVar2 = *func;
    unpackValues(func,(FuncValuePack *)pFVar15);
    local_78 = (FuncDetail *)CONCAT71(local_78._1_7_,FVar2);
    pFVar5 = (FuncValue *)0xc000000;
    local_68 = (FuncDetail *)0x16000000;
    if (((byte)FVar2 & 1) == 0) {
      local_68 = (FuncDetail *)0xc000000;
    }
    iVar12 = 0x16000100;
    for (uVar14 = 0; uVar14 != 4; uVar14 = uVar14 + 1) {
      pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
      uVar7 = pFVar5->_data;
      uVar16 = uVar7 & 0xff;
      pFVar5 = (FuncValue *)(ulong)(uVar16 - 0x22);
      switch(pFVar5) {
      case (FuncValue *)0x0:
      case (FuncValue *)0x2:
      case (FuncValue *)0x4:
        if (1 < uVar14) {
          return 3;
        }
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        uVar8 = (uint)""[uVar14] << 0x10 | 0x6000126;
        break;
      case (FuncValue *)0x1:
      case (FuncValue *)0x3:
      case (FuncValue *)0x5:
        if (1 < uVar14) {
          return 3;
        }
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        uVar8 = (uint)""[uVar14] << 0x10 | 0x6000127;
        break;
      case (FuncValue *)0x6:
      case (FuncValue *)0x7:
        if (1 < uVar14) {
          return 3;
        }
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        uVar8 = (uint)""[uVar14] * 0x10000 + uVar16 + 0x7000100;
        break;
      case (FuncValue *)0x8:
      case (FuncValue *)0x9:
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        uVar8 = (int)local_68 + iVar12 + uVar16 + 0xea000000;
        break;
      case (FuncValue *)0xa:
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        pFVar5->_data = uVar16 + iVar12;
        goto LAB_00143a98;
      case (FuncValue *)0xb:
      case (FuncValue *)0xc:
      case (FuncValue *)0xd:
      case (FuncValue *)0xe:
        goto switchD_00143977_caseD_b;
      case (FuncValue *)0xf:
      case (FuncValue *)0x10:
        if (((ulong)local_78 & 1) == 0) {
          if (local_70[2] == (FuncDetail)0x0) {
            uVar7 = 0xc000000;
            goto LAB_00143aac;
          }
          if (1 < uVar14) {
            return 3;
          }
          uVar11 = (uint)""[uVar14];
          uVar7 = 0x7000000;
        }
        else {
          uVar7 = 0x12000000;
LAB_00143aac:
          uVar11 = (uint)uVar14;
        }
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        pFVar5->_data = uVar16 + (uVar11 << 0x10 | uVar7) + 0x100;
        goto LAB_00143a98;
      default:
        if (uVar16 == 0) goto LAB_00143adb;
switchD_00143977_caseD_b:
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)pFVar15,uVar14);
        bVar10 = (byte)uVar7;
        uVar7 = (uint)(0x5a < bVar10) * 0x1000000 + 0xd000000;
        if (bVar10 < 0x51) {
          uVar7 = 0xc000000;
        }
        uVar8 = (uVar7 | uVar16) + iVar12 + 0xea000000;
      }
      pFVar5->_data = uVar8;
LAB_00143a98:
      iVar12 = iVar12 + 0x10000;
    }
  }
LAB_00143adb:
  local_48 = (FuncValue *)CONCAT71((int7)((ulong)pFVar5 >> 8),local_70[2]);
  if ((byte)((char)local_70[2] - 1U) < 2) {
    local_50 = (FuncSignature *)(local_70 + 0x9c);
    local_58 = local_70 + 0x34;
    pFVar15 = local_70;
    for (pFVar9 = (FuncDetail *)0x0; pFVar9 != (FuncDetail *)local_40;
        pFVar9 = (FuncDetail *)((long)&((FuncValue *)pFVar9)->_data + 1)) {
      local_68 = (FuncDetail *)((long)local_50 + (long)pFVar9 * 0x10);
      unpackValues(pFVar15,(FuncValuePack *)local_68);
      local_78 = pFVar9;
      for (sVar13 = 0; sVar13 != 4; sVar13 = sVar13 + 1) {
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)local_68,sVar13);
        uVar7 = pFVar5->_data;
        if ((ulong)uVar7 == 0) break;
        uVar14 = (ulong)uVar7 & 0xff;
        iVar12 = (int)uVar14;
        if (iVar12 - 0x31U < 2 || iVar12 - 0x20U < 10) {
          if (pFVar9 < (FuncValue *)0x10) {
            bVar10 = TypeUtils::_typeData[uVar14 + 0x100];
            local_7d[2] = 0;
            pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_58,
                                local_7d + 2);
            bVar3 = pRVar6->id[(long)local_78];
            if (bVar3 != 0xff) {
              if (bVar10 < 5) {
                RVar4 = iVar12 - 0x31U < 2 | kARM_GpW;
              }
              else {
                RVar4 = kARM_GpX;
              }
              FuncValue::assignRegData(pFVar5,RVar4,(uint)bVar3);
              *(uint *)(pFVar15 + 0x78) = *(uint *)(pFVar15 + 0x78) | 1 << (bVar3 & 0x1f);
              pFVar9 = local_78;
              goto LAB_00143ce0;
            }
          }
LAB_00143c75:
          FuncValue::assignStackOffset(pFVar5,local_84);
LAB_00143c83:
          local_84 = local_84 + 8;
          pFVar9 = local_78;
        }
        else {
          uVar16 = iVar12 - 0x2a;
          if (iVar12 - 0x33U < 0x32 || uVar16 < 3) {
            if (pFVar9 < (FuncValue *)0x10) {
              local_5c = CONCAT31(local_5c._1_3_,2 < uVar16);
              bVar17 = (char)local_48 != '\x02';
              local_7d[1] = 1;
              pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_58,
                                  local_7d + 1);
              pFVar15 = local_70;
              bVar10 = pRVar6->id[(long)local_78];
              if ((bVar17 & (byte)local_5c) == 0 && bVar10 != 0xff) {
                RVar4 = kVec512 - ((byte)uVar7 < 0x5b);
                if ((byte)uVar7 < 0x51) {
                  RVar4 = kARM_VecQ;
                }
                FuncValue::assignRegData(pFVar5,RVar4,(uint)bVar10);
                *(uint *)(pFVar15 + 0x7c) = *(uint *)(pFVar15 + 0x7c) | 1 << (bVar10 & 0x1f);
                pFVar9 = local_78;
                goto LAB_00143ce0;
              }
            }
            if (uVar16 < 3) goto LAB_00143c75;
            local_7d[0] = k0;
            pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_58,local_7d);
            if (pRVar6->id[(long)local_78] == 0xff) {
              FuncValue::assignStackOffset(pFVar5,local_84);
            }
            else {
              FuncValue::assignRegData(pFVar5,kARM_GpX,(uint)pRVar6->id[(long)local_78]);
            }
            pbVar1 = (byte *)((long)&pFVar5->_data + 1);
            *pbVar1 = *pbVar1 | 4;
            goto LAB_00143c83;
          }
        }
LAB_00143ce0:
      }
    }
  }
  else {
    local_38 = local_70 + 0x9c;
    local_58 = local_70 + 0x34;
    local_68 = (FuncDetail *)((ulong)local_68 & 0xffffffff00000000);
    uVar14 = 0;
    for (local_48 = (FuncValue *)0x0; pFVar15 = local_70, local_48 != local_40;
        local_48 = (FuncValue *)((long)&local_48->_data + 1)) {
      local_78 = local_38 + (long)local_48 * 0x10;
      unpackValues(local_70,(FuncValuePack *)local_78);
      for (sVar13 = 0; sVar13 != 4; sVar13 = sVar13 + 1) {
        pFVar5 = FuncValuePack::operator[]((FuncValuePack *)local_78,sVar13);
        uVar7 = pFVar5->_data;
        if (uVar7 == 0) break;
        bVar10 = (byte)uVar7;
        if ((uVar7 & 0xff) - 0x20 < 10) {
          if ((uint)uVar14 < 0x10) {
            local_7d[4] = 0;
            pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                     operator[]<asmjit::v1_14::RegGroup>
                               ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_58,
                                local_7d + 4);
            bVar3 = pRVar6->id[uVar14];
            if (bVar3 != 0xff) {
              FuncValue::assignRegData(pFVar5,kARM_GpX - (bVar10 < 0x28),(uint)bVar3);
              *(uint *)(local_70 + 0x78) = *(uint *)(local_70 + 0x78) | 1 << (bVar3 & 0x1f);
              uVar14 = (ulong)((uint)uVar14 + 1);
              goto LAB_00143ee3;
            }
          }
          uVar7 = (uint)(byte)TypeUtils::_typeData[(ulong)bVar10 + 0x100];
          if ((byte)TypeUtils::_typeData[(ulong)bVar10 + 0x100] <= local_5c) {
            uVar7 = local_5c;
          }
LAB_00143ecf:
          FuncValue::assignStackOffset(pFVar5,local_84);
          local_84 = local_84 + uVar7;
        }
        else {
          uVar16 = (uVar7 & 0xff) - 0x2a;
          if ((uVar7 & 0xff) - 0x33 < 0x32 || uVar16 < 3) {
            uVar8 = 0xff;
            if ((uint)local_68 < 0x10) {
              local_7d[3] = 1;
              pRVar6 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                       operator[]<asmjit::v1_14::RegGroup>
                                 ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)local_58,
                                  local_7d + 3);
              uVar8 = (uint32_t)pRVar6->id[(ulong)local_68 & 0xffffffff];
            }
            if (uVar16 < 3) {
              if (((byte)local_70[8] & 4) != 0) {
LAB_00143e7d:
                if (uVar8 != 0xff) {
                  pFVar5->_data = uVar7 & 0xff;
                  RVar4 = kVec512 - (bVar10 < 0x5b);
                  if (bVar10 < 0x51) {
                    RVar4 = kARM_VecQ;
                  }
                  FuncValue::assignRegData(pFVar5,RVar4,uVar8);
                  *(uint *)(local_70 + 0x7c) =
                       *(uint *)(local_70 + 0x7c) | 1 << ((byte)uVar8 & 0x1f);
                  local_68 = (FuncDetail *)CONCAT44(local_68._4_4_,(uint)local_68 + 1);
                  goto LAB_00143ee3;
                }
              }
            }
            else if ((local_50->_vaIndex == 0xff) || (((byte)local_70[8] & 8) == 0))
            goto LAB_00143e7d;
            uVar7 = (uint)(byte)TypeUtils::_typeData[(ulong)bVar10 + 0x100];
            goto LAB_00143ecf;
          }
        }
LAB_00143ee3:
      }
    }
  }
  *(uint *)(pFVar15 + 0x88) = local_84;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature, uint32_t registerSize) noexcept {
  const CallConv& cc = func.callConv();
  Arch arch = cc.arch();
  uint32_t stackOffset = cc._spillZoneSize;
  uint32_t argCount = func.argCount();

  // Up to two return values can be returned in GP registers.
  static const uint8_t gpReturnIndexes[4] = {
    uint8_t(Gp::kIdAx),
    uint8_t(Gp::kIdDx),
    uint8_t(BaseReg::kIdBad),
    uint8_t(BaseReg::kIdBad)
  };

  if (func.hasRet()) {
    unpackValues(func, func._rets);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt64:
        case TypeId::kUInt64: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpq, gpReturnIndexes[valueIndex], typeId);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(RegType::kX86_Gpd, gpReturnIndexes[valueIndex], TypeId::kUInt32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case TypeId::kFloat32:
        case TypeId::kFloat64: {
          RegType regType = Environment::is32Bit(arch) ? RegType::kX86_St : RegType::kX86_Xmm;
          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }

        case TypeId::kFloat80: {
          // 80-bit floats are always returned by FP0.
          func._rets[valueIndex].initReg(RegType::kX86_St, valueIndex, typeId);
          break;
        }

        case TypeId::kMmx32:
        case TypeId::kMmx64: {
          // MM registers are returned through XMM (SystemV) or GPQ (Win64).
          RegType regType = RegType::kX86_Mm;
          uint32_t regIndex = valueIndex;
          if (Environment::is64Bit(arch)) {
            regType = cc.strategy() == CallConvStrategy::kDefault ? RegType::kX86_Xmm : RegType::kX86_Gpq;
            regIndex = cc.strategy() == CallConvStrategy::kDefault ? valueIndex : gpReturnIndexes[valueIndex];

            if (regIndex == BaseReg::kIdBad)
              return DebugUtils::errored(kErrorInvalidState);
          }

          func._rets[valueIndex].initReg(regType, regIndex, typeId);
          break;
        }

        default: {
          func._rets[valueIndex].initReg(vecTypeIdToRegType(typeId), valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    default: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();

          if (TypeUtils::isInt(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (gpzPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

            if (regId != BaseReg::kIdBad) {
              RegType regType = typeId <= TypeId::kUInt32 ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
              gpzPos++;
            }
            else {
              uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), registerSize);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (vecPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

            if (TypeUtils::isFloat(typeId)) {
              // If this is a float, but `kFlagPassFloatsByVec` is false, we have to use stack instead. This should
              // be only used by 32-bit calling conventions.
              if (!cc.hasFlag(CallConvFlags::kPassFloatsByVec))
                regId = BaseReg::kIdBad;
            }
            else {
              // Pass vector registers via stack if this is a variable arguments function. This should be only used
              // by 32-bit calling conventions.
              if (signature.hasVarArgs() && cc.hasFlag(CallConvFlags::kPassVecByStackIfVA))
                regId = BaseReg::kIdBad;
            }

            if (regId != BaseReg::kIdBad) {
              arg.initTypeId(typeId);
              arg.assignRegData(vecTypeIdToRegType(typeId), regId);
              func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
              vecPos++;
            }
            else {
              uint32_t size = TypeUtils::sizeOf(typeId);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }
        }
      }
      break;
    }

    case CallConvStrategy::kX64Windows:
    case CallConvStrategy::kX64VectorCall: {
      // Both X64 and VectorCall behave similarly - arguments are indexed from left to right. The position of the
      // argument determines in which register the argument is allocated, so it's either GP or one of XMM/YMM/ZMM
      // registers.
      //
      //       [       X64       ] [VecCall]
      // Index: #0   #1   #2   #3   #4   #5
      //
      // GP   : RCX  RDX  R8   R9
      // VEC  : XMM0 XMM1 XMM2 XMM3 XMM4 XMM5
      //
      // For example function `f(int a, double b, int c, double d)` will be:
      //
      //        (a)  (b)  (c)  (d)
      //        RCX  XMM1 R8   XMM3
      //
      // Unused vector registers are used by HVA.
      bool isVectorCall = (cc.strategy() == CallConvStrategy::kX64VectorCall);

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          TypeId typeId = arg.typeId();
          uint32_t size = TypeUtils::sizeOf(typeId);

          if (TypeUtils::isInt(typeId) || TypeUtils::isMmx(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kGp].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              RegType regType = size <= 4 && !TypeUtils::isMmx(typeId) ? RegType::kX86_Gpd : RegType::kX86_Gpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            }
            else {
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += 8;
            }
            continue;
          }

          if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[RegGroup::kVec].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              // X64-ABI doesn't allow vector types (XMM|YMM|ZMM) to be passed via registers, however, VectorCall
              // was designed for that purpose.
              if (TypeUtils::isFloat(typeId) || isVectorCall) {
                RegType regType = vecTypeIdToRegType(typeId);
                arg.assignRegData(regType, regId);
                func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
                continue;
              }
            }

            // Passed via stack if the argument is float/double or indirectly. The trap is - if the argument is
            // passed indirectly, the address can be passed via register, if the argument's index has GP one.
            if (TypeUtils::isFloat(typeId)) {
              arg.assignStackOffset(int32_t(stackOffset));
            }
            else {
              uint32_t gpRegId = cc._passedOrder[RegGroup::kGp].id[argIndex];
              if (gpRegId != BaseReg::kIdBad)
                arg.assignRegData(RegType::kX86_Gpq, gpRegId);
              else
                arg.assignStackOffset(int32_t(stackOffset));
              arg.addFlags(FuncValue::kFlagIsIndirect);
            }

            // Always 8 bytes (float/double/pointer).
            stackOffset += 8;
            continue;
          }
        }
      }
      break;
    }
  }

  func._argStackSize = stackOffset;
  return kErrorOk;
}